

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O2

void pstore::command_line::
     apply_to_option<pstore::command_line::opt<int,pstore::command_line::parser<int,void>>&,char_const(&)[5]>
               (opt<int,_pstore::command_line::parser<int,_void>_> *opt,char (*m0) [5])

{
  string local_30;
  
  make_modifier((name *)&local_30,*m0);
  option::set_name(&opt->super_option,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }